

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::error_already_set::~error_already_set(error_already_set *this)

{
  bool bVar1;
  handle local_50;
  handle local_48;
  handle local_40;
  undefined1 local_38 [8];
  gil_scoped_acquire gil;
  error_scope scope;
  error_already_set *this_local;
  
  *(undefined ***)this = &PTR__error_already_set_001db940;
  bVar1 = handle::operator_cast_to_bool(&(this->type).super_handle);
  if (bVar1) {
    error_scope::error_scope((error_scope *)&gil.release);
    gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)local_38);
    local_40 = object::release(&this->type);
    handle::dec_ref(&local_40);
    local_48 = object::release(&this->value);
    handle::dec_ref(&local_48);
    local_50 = object::release(&this->trace);
    handle::dec_ref(&local_50);
    gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)local_38);
    error_scope::~error_scope((error_scope *)&gil.release);
  }
  object::~object(&this->trace);
  object::~object(&this->value);
  object::~object(&this->type);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

error_already_set::~error_already_set() {
    if (type) {
        error_scope scope;
        gil_scoped_acquire gil;
        type.release().dec_ref();
        value.release().dec_ref();
        trace.release().dec_ref();
    }
}